

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskDataset.cpp
# Opt level: O2

vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *
OnDiskDataset::get_compact_candidates
          (vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
           *__return_storage_ptr__,
          vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets)

{
  pointer ppOVar1;
  OnDiskDataset *pOVar2;
  pointer pOVar3;
  pointer pDVar4;
  pointer pDVar5;
  pointer pDVar6;
  uint uVar7;
  long lVar8;
  pointer pDVar9;
  pointer __n;
  __normal_iterator<DatasetScore_*,_std::vector<DatasetScore,_std::allocator<DatasetScore>_>_> __i;
  pointer ppOVar10;
  uint64_t uVar11;
  long lVar12;
  pointer __p;
  pointer pOVar13;
  pointer pDVar14;
  ulong uVar15;
  vector<DatasetScore,_std::allocator<DatasetScore>_> scores;
  path local_f0;
  path local_b0;
  path local_70;
  
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppOVar10 = (datasets->
             super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
             _M_impl.super__Vector_impl_data._M_start;
  ppOVar1 = (datasets->
            super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if (8 < (ulong)((long)ppOVar1 - (long)ppOVar10)) {
    scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    for (; pDVar6 = scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                    super__Vector_impl_data._M_finish,
        pDVar5 = scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                 super__Vector_impl_data._M_start, ppOVar10 != ppOVar1; ppOVar10 = ppOVar10 + 1) {
      pOVar2 = *ppOVar10;
      pOVar3 = (pOVar2->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar11 = 0;
      for (pOVar13 = (pOVar2->indices).super__Vector_base<OnDiskIndex,_std::allocator<OnDiskIndex>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pDVar6 = scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                   super__Vector_impl_data._M_finish,
          pDVar5 = scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                   super__Vector_impl_data._M_start, pOVar13 != pOVar3; pOVar13 = pOVar13 + 1) {
        std::experimental::filesystem::v1::__cxx11::path::path(&local_f0,&pOVar2->db_base);
        std::experimental::filesystem::v1::__cxx11::path::
        path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
                  (&local_b0,&pOVar13->fname);
        std::experimental::filesystem::v1::__cxx11::operator/(&local_70,&local_f0,&local_b0);
        lVar8 = std::experimental::filesystem::v1::file_size(&local_70);
        uVar11 = uVar11 + lVar8;
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_70);
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_b0);
        std::experimental::filesystem::v1::__cxx11::path::~path(&local_f0);
      }
      if (scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        __p = (pointer)((long)scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4);
        pDVar9 = __p;
        if (scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pDVar9 = (pointer)0x1;
        }
        uVar15 = (long)&__p->ds + (long)&pDVar9->ds;
        if (0x7fffffffffffffe < uVar15) {
          uVar15 = 0x7ffffffffffffff;
        }
        if (CARRY8((ulong)pDVar9,(ulong)__p)) {
          uVar15 = 0x7ffffffffffffff;
        }
        if (uVar15 == 0) {
          pDVar9 = (pointer)0x0;
        }
        else {
          pDVar9 = (pointer)operator_new(uVar15 << 4);
        }
        pDVar9[(long)__p].ds = pOVar2;
        pDVar9[(long)__p].size = uVar11;
        pDVar4 = pDVar9;
        for (__n = pDVar5; pDVar14 = pDVar4 + 1, __n != pDVar6; __n = __n + 1) {
          uVar11 = __n->size;
          pDVar4->ds = __n->ds;
          pDVar4->size = uVar11;
          pDVar4 = pDVar14;
        }
        std::_Vector_base<DatasetScore,_std::allocator<DatasetScore>_>::_M_deallocate
                  ((_Vector_base<DatasetScore,_std::allocator<DatasetScore>_> *)pDVar5,__p,
                   (size_t)__n);
        scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = pDVar9 + uVar15;
        scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
        super__Vector_impl_data._M_start = pDVar9;
      }
      else {
        (scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
         super__Vector_impl_data._M_finish)->ds = pOVar2;
        (scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
         super__Vector_impl_data._M_finish)->size = uVar11;
        pDVar14 = scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
      }
      scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
      super__Vector_impl_data._M_finish = pDVar14;
    }
    if (scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
        super__Vector_impl_data._M_start !=
        scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar12 = (long)scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar15 = lVar12 >> 4;
      lVar8 = 0x3f;
      if (uVar15 != 0) {
        for (; uVar15 >> lVar8 == 0; lVar8 = lVar8 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                (scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 scores.super__Vector_base<DatasetScore,_std::allocator<DatasetScore>_>._M_impl.
                 super__Vector_impl_data._M_finish,((uint)lVar8 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x101) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                  (pDVar5,pDVar6);
      }
      else {
        pDVar9 = pDVar5 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,__gnu_cxx::__ops::_Iter_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                  (pDVar5,pDVar9);
        for (; pDVar9 != pDVar6; pDVar9 = pDVar9 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore*,std::vector<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore,std::allocator<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::DatasetScore>>>,__gnu_cxx::__ops::_Val_comp_iter<OnDiskDataset::get_compact_candidates(std::vector<OnDiskDataset_const*,std::allocator<OnDiskDataset_const*>>const&)::compare_size>>
                    (pDVar9);
        }
      }
    }
    std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
              (__return_storage_ptr__,&pDVar5->ds);
    uVar7 = 0;
    while( true ) {
      uVar15 = (ulong)(uVar7 + 1);
      if (((ulong)((long)pDVar6 - (long)pDVar5 >> 4) <= uVar15) ||
         (pDVar5[uVar7].size * 2 <= pDVar5[uVar15].size)) break;
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
                (__return_storage_ptr__,&pDVar5[uVar15].ds);
      uVar7 = uVar7 + 1;
    }
    ppOVar10 = (__return_storage_ptr__->
               super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
               _M_impl.super__Vector_impl_data._M_start;
    ppOVar1 = (__return_storage_ptr__->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)ppOVar1 - (long)ppOVar10) < 9 && ppOVar1 != ppOVar10) {
      (__return_storage_ptr__->
      super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>)._M_impl.
      super__Vector_impl_data._M_finish = ppOVar10;
    }
    std::vector<DatasetScore,_std::allocator<DatasetScore>_>::~vector(&scores);
  }
  return __return_storage_ptr__;
}

Assistant:

void OnDiskDataset::execute(const Query &query, ResultWriter *out,
                            QueryCounters *counters) const {
    std::unordered_set<IndexType> types_to_query;
    for (const auto &ndx : get_indexes()) {
        types_to_query.emplace(ndx.index_type());
    }
    Query plan = query.plan(types_to_query);
    plan = q_optimize(std::move(plan));
    spdlog::debug("PLAN: {}", plan);

    QueryResult result = this->query(plan, counters);
    if (result.is_everything()) {
        files_index->for_each_filename(
            [&out](const std::string &fname) { out->push_back(fname); });
    } else {
        for (const auto &fid : result.vector().decompressed()) {
            out->push_back(get_file_name(fid));
        }
    }
}